

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_stepboundinfo(void *ptr,int nelem,int type)

{
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  Integer in_stack_00000158;
  char *in_stack_00000160;
  int local_14;
  
  switch(in_EDX) {
  case 0x3e9:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (0x7ffffffe < *(int *)(in_RDI + (long)local_14 * 4)) {
        *(undefined4 *)(in_RDI + (long)local_14 * 4) = 0x80000001;
      }
    }
    break;
  case 0x3ea:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (0x7ffffffffffffffe < *(long *)(in_RDI + (long)local_14 * 8)) {
        *(undefined8 *)(in_RDI + (long)local_14 * 8) = 0x8000000000000001;
      }
    }
    break;
  case 0x3ec:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (1e+307 <= *(double *)(in_RDI + (long)local_14 * 8)) {
        *(undefined8 *)(in_RDI + (long)local_14 * 8) = 0xffac7b1f3cac7433;
      }
    }
    break;
  default:
    pnga_error(in_stack_00000160,in_stack_00000158);
    break;
  case 0x3ee:
  case 0x3ef:
    pnga_error(in_stack_00000160,in_stack_00000158);
  case 0x3eb:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (1e+37 <= *(float *)(in_RDI + (long)local_14 * 4)) {
        *(undefined4 *)(in_RDI + (long)local_14 * 4) = 0xfcf0bdc2;
      }
    }
  }
  return;
}

Assistant:

static void do_stepboundinfo(void *ptr, int nelem, int type)
/*look at elements one by one and replace the positive infinity with negative infinity */ 
{
    int i;
    switch (type){
         int *ia;
         double *da;
         float *fa;
         long *la;

  	 case C_DBL:
                /*Only double data type will be handled for TAO/GA project*/ 
              da = (double *) ptr;
              for(i=0;i<nelem;i++)
		/* Modified 01/24/04 to add _D ending to constants. */
		if(da[i]>=GA_INFINITY_D) da[i]=-GA_INFINITY_D;
              break;
         case C_INT:
	   /* This block added 01/24/04 */
	   ia = (int *) ptr;
	   for (i=0;i<nelem;i++)
	     if (ia[i]>= GA_INFINITY_I) ia[i] = GA_NEGATIVE_INFINITY_I;
	   break;
         case C_DCPL: 
         case C_SCPL: 
	   /* This operation is not well defined for complex
	      numbers . This statement added when drop through
	      behavior changed by adding code for C_FLOAT and C_LONG
	      cases below. 01/24/04
	   */
	   pnga_error("do_stepboundinfo:wrong data type",type);
         case C_FLOAT:
	   /* This case added 01/24/04 */
	   fa = (float *) ptr;
	   for (i=0;i<nelem;i++)
	     if (fa[i]>= GA_INFINITY_F) fa[i] = GA_NEGATIVE_INFINITY_F;
	   break;
 	case C_LONG:
	   /* This case added 01/24/04 */
	   la = (long *) ptr;
	   for (i=0;i<nelem;i++)
	     if (la[i]>= GA_INFINITY_L) la[i] = GA_NEGATIVE_INFINITY_L;
	   break;
         default: pnga_error("do_stepboundinfo:wrong data type",type);
    }
}